

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int bgzf_compress(void *_dst,int *dlen,void *src,int slen,int level)

{
  uint8_t *puVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  int iVar5;
  void *local_98;
  int local_90;
  long local_80;
  int local_78;
  int local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  
  local_58 = 0;
  uStack_50 = 0;
  local_80 = (long)_dst + 0x12;
  local_78 = *dlen + -0x1a;
  local_98 = src;
  local_90 = slen;
  iVar2 = deflateInit2_(&local_98,level,8,0xfffffff1,8,0,"1.2.11",0x70);
  iVar5 = -1;
  if (iVar2 == 0) {
    iVar2 = deflate(&local_98,4);
    if (iVar2 == 1) {
      iVar2 = deflateEnd(&local_98);
      if (iVar2 == 0) {
        *dlen = local_70 + 0x1a;
        *(undefined4 *)_dst = 0x4088b1f;
        puVar1 = (uint8_t *)((long)_dst + 4);
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1 = (uint8_t *)((long)_dst + 8);
        puVar1[0] = '\0';
        puVar1[1] = 0xff;
        puVar1[2] = '\x06';
        puVar1[3] = '\0';
        builtin_memcpy((uint8_t *)((long)_dst + 0xc),"BC\x02",4);
        *(undefined2 *)((long)_dst + 0x10) = 0;
        *(short *)((long)_dst + 0x10) = (short)*dlen + -1;
        iVar5 = 0;
        uVar4 = crc32(0,0,0);
        uVar3 = crc32(uVar4,src,slen);
        *(undefined4 *)((long)_dst + (long)*dlen + -8) = uVar3;
        *(int *)((long)_dst + (long)*dlen + -4) = slen;
      }
    }
  }
  return iVar5;
}

Assistant:

static int bgzf_compress(void *_dst, int *dlen, void *src, int slen, int level)
{
    uint32_t crc;
    z_stream zs;
    uint8_t *dst = (uint8_t*)_dst;

    // compress the body
    zs.zalloc = NULL; zs.zfree = NULL;
    zs.next_in  = (Bytef*)src;
    zs.avail_in = slen;
    zs.next_out = dst + BLOCK_HEADER_LENGTH;
    zs.avail_out = *dlen - BLOCK_HEADER_LENGTH - BLOCK_FOOTER_LENGTH;
    if (deflateInit2(&zs, level, Z_DEFLATED, -15, 8, Z_DEFAULT_STRATEGY) != Z_OK) return -1; // -15 to disable zlib header/footer
    if (deflate(&zs, Z_FINISH) != Z_STREAM_END) return -1;
    if (deflateEnd(&zs) != Z_OK) return -1;
    *dlen = zs.total_out + BLOCK_HEADER_LENGTH + BLOCK_FOOTER_LENGTH;
    // write the header
    memcpy(dst, g_magic, BLOCK_HEADER_LENGTH); // the last two bytes are a place holder for the length of the block
    packInt16(&dst[16], *dlen - 1); // write the compressed length; -1 to fit 2 bytes
    // write the footer
    crc = crc32(crc32(0L, NULL, 0L), (Bytef*)src, slen);
    packInt32((uint8_t*)&dst[*dlen - 8], crc);
    packInt32((uint8_t*)&dst[*dlen - 4], slen);
    return 0;
}